

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

uint32_t write_tile_group_header
                   (uint8_t *dst,int start_tile,int end_tile,int tiles_log2,
                   int tile_start_and_end_present_flag)

{
  int in_ECX;
  aom_write_bit_buffer *in_RDI;
  int in_R8D;
  uint32_t size;
  aom_write_bit_buffer wb;
  int in_stack_ffffffffffffffc8;
  int data;
  uint32_t local_4;
  
  data = 0;
  if (in_ECX == 0) {
    local_4 = 0;
  }
  else {
    aom_wb_write_bit((aom_write_bit_buffer *)&stack0xffffffffffffffd0,in_R8D);
    if (in_R8D != 0) {
      aom_wb_write_literal(in_RDI,data,in_stack_ffffffffffffffc8);
      aom_wb_write_literal(in_RDI,data,in_stack_ffffffffffffffc8);
    }
    local_4 = aom_wb_bytes_written((aom_write_bit_buffer *)&stack0xffffffffffffffd0);
  }
  return local_4;
}

Assistant:

static uint32_t write_tile_group_header(uint8_t *const dst, int start_tile,
                                        int end_tile, int tiles_log2,
                                        int tile_start_and_end_present_flag) {
  struct aom_write_bit_buffer wb = { dst, 0 };
  uint32_t size = 0;

  if (!tiles_log2) return size;

  aom_wb_write_bit(&wb, tile_start_and_end_present_flag);

  if (tile_start_and_end_present_flag) {
    aom_wb_write_literal(&wb, start_tile, tiles_log2);
    aom_wb_write_literal(&wb, end_tile, tiles_log2);
  }

  size = aom_wb_bytes_written(&wb);
  return size;
}